

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
test::string_assertion_test::iu_StrTest_x_iutest_x_EqString_Test<char>::Body
          (iu_StrTest_x_iutest_x_EqString_Test<char> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  char *pcVar3;
  type **in_stack_ffffffffffffeca8;
  Fixed *this_00;
  AssertionHelper local_12d8;
  Fixed local_12a8;
  string local_1120 [32];
  undefined1 local_1100 [8];
  AssertionResult iutest_ar_8;
  Fixed local_10a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f20;
  string local_f00 [32];
  undefined1 local_ee0 [8];
  AssertionResult iutest_ar_7;
  AssertionHelper local_eb0;
  Fixed local_e80;
  string local_cf8 [32];
  undefined1 local_cd8 [8];
  AssertionResult iutest_ar_6;
  Fixed local_c80;
  string local_af8 [32];
  undefined1 local_ad8 [8];
  AssertionResult iutest_ar_5;
  Fixed local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  string local_8d8 [32];
  undefined1 local_8b8 [8];
  AssertionResult iutest_ar_4;
  Fixed local_860;
  string local_6d8 [32];
  undefined1 local_6b8 [8];
  AssertionResult iutest_ar_3;
  Fixed local_660;
  string local_4d8 [32];
  undefined1 local_4b8 [8];
  AssertionResult iutest_ar_2;
  Fixed local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8 [32];
  undefined1 local_298 [8];
  AssertionResult iutest_ar_1;
  Fixed local_240;
  string local_b8 [32];
  undefined1 local_98 [8];
  AssertionResult iutest_ar;
  string local_68 [8];
  String test2;
  allocator<char> local_31;
  string local_30 [8];
  String test1;
  iu_StrTest_x_iutest_x_EqString_Test<char> *this_local;
  
  pbVar1 = text<char>::test;
  test1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,(char *)pbVar1,&local_31);
  std::allocator<char>::~allocator(&local_31);
  pbVar1 = text<char>::test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,(char *)pbVar1,(allocator<char> *)&iutest_ar.field_0x27);
  std::allocator<char>::~allocator((allocator<char> *)&iutest_ar.field_0x27);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_b8,local_30);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,char_const*>
            ((AssertionResult *)local_98,(internal *)"test1","TestFixture::Text::test",
             (char *)local_b8,text<char>::test,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string(local_b8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    memset(&local_240,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_240);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_98);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x76,pcVar3,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_240);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_240);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_2b8,local_30);
  std::__cxx11::string::string((string *)&local_2d8,local_68);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_298,(internal *)"test1","test2",(char *)local_2b8,&local_2d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string(local_2b8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar2) {
    memset(&local_460,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_460);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_298);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x77,pcVar3,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_460);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_460);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  iutest::detail::AlwaysZero();
  pbVar1 = text<char>::test;
  std::__cxx11::string::string(local_4d8,local_68);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_4b8,(internal *)"TestFixture::Text::test","test2",
             (char *)pbVar1,(char *)local_4d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string(local_4d8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar2) {
    memset(&local_660,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_660);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_4b8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x78,pcVar3,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_660);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_660);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_6d8,local_30);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,char_const*>
            ((AssertionResult *)local_6b8,(internal *)"test1","TestFixture::Text::test",
             (char *)local_6d8,text<char>::test,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string(local_6d8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar2) {
    memset(&local_860,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_860);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_6b8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x7a,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_860);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_860);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_8d8,local_30);
  std::__cxx11::string::string((string *)&local_8f8,local_68);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_8b8,(internal *)"test1","test2",(char *)local_8d8,&local_8f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string(local_8d8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar2) {
    memset(&local_a80,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_a80);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_8b8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x7b,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_a80);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_a80);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  iutest::detail::AlwaysZero();
  pbVar1 = text<char>::test;
  std::__cxx11::string::string(local_af8,local_68);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_ad8,(internal *)"TestFixture::Text::test","test2",
             (char *)pbVar1,(char *)local_af8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string(local_af8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
  if (!bVar2) {
    memset(&local_c80,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_c80);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_ad8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_6.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x7c,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_6.m_result,&local_c80);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_c80);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
  iutest::detail::AlwaysZero();
  std::__cxx11::string::string(local_cf8,local_30);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,char_const*>
            ((AssertionResult *)local_cd8,(internal *)"test1","TestFixture::Text::test",
             (char *)local_cf8,text<char>::test,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_ffffffffffffeca8);
  std::__cxx11::string::~string(local_cf8);
  bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd8);
  if (!bVar2) {
    memset(&local_e80,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_e80);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_cd8);
    iutest::AssertionHelper::AssertionHelper
              (&local_eb0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x7e,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_eb0,&local_e80);
    iutest::AssertionHelper::~AssertionHelper(&local_eb0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_e80);
  }
  iutest_ar_7._37_3_ = 0;
  iutest_ar_7._36_1_ = !bVar2;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_cd8);
  if (iutest_ar_7._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    std::__cxx11::string::string(local_f00,local_30);
    std::__cxx11::string::string((string *)&local_f20,local_68);
    iutest::internal::CmpHelperSTREQ<std::__cxx11::string,std::__cxx11::string>
              ((AssertionResult *)local_ee0,(internal *)"test1","test2",(char *)local_f00,&local_f20
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
    std::__cxx11::string::~string((string *)&local_f20);
    std::__cxx11::string::~string(local_f00);
    bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ee0);
    if (!bVar2) {
      memset(&local_10a8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_10a8);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_ee0);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_8.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0x7f,pcVar3,kFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_8.m_result,&local_10a8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_8.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_10a8);
    }
    iutest_ar_7._37_3_ = 0;
    iutest_ar_7._36_1_ = !bVar2;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_ee0);
    if (iutest_ar_7._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      pbVar1 = text<char>::test;
      std::__cxx11::string::string(local_1120,local_68);
      iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
                ((AssertionResult *)local_1100,(internal *)"TestFixture::Text::test","test2",
                 (char *)pbVar1,(char *)local_1120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &iutest_type_traits::enabler_t<void>::value,in_stack_ffffffffffffeca8);
      std::__cxx11::string::~string(local_1120);
      bVar2 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1100);
      if (!bVar2) {
        this_00 = &local_12a8;
        memset(this_00,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(this_00);
        pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_1100);
        iutest::AssertionHelper::AssertionHelper
                  (&local_12d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                   ,0x80,pcVar3,kFatalFailure);
        iutest::AssertionHelper::operator=(&local_12d8,&local_12a8);
        iutest::AssertionHelper::~AssertionHelper(&local_12d8);
        iutest::AssertionHelper::Fixed::~Fixed(&local_12a8);
      }
      iutest_ar_7._37_3_ = 0;
      iutest_ar_7._36_1_ = !bVar2;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1100);
      if (iutest_ar_7._36_4_ == 0) {
        iutest_ar_7._36_4_ = 0;
      }
    }
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, EqString)
{
    typename TestFixture::String test1 = TestFixture::Text::test;
    typename TestFixture::String test2 = TestFixture::Text::test;
    IUTEST_INFORM_STREQ(test1, TestFixture::Text::test);
    IUTEST_INFORM_STREQ(test1, test2);
    IUTEST_INFORM_STREQ(TestFixture::Text::test, test2);

    IUTEST_EXPECT_STREQ(test1, TestFixture::Text::test);
    IUTEST_EXPECT_STREQ(test1, test2);
    IUTEST_EXPECT_STREQ(TestFixture::Text::test, test2);

    IUTEST_ASSERT_STREQ(test1, TestFixture::Text::test);
    IUTEST_ASSERT_STREQ(test1, test2);
    IUTEST_ASSERT_STREQ(TestFixture::Text::test, test2);
}